

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::AddCapability(IRContext *this,Capability capability)

{
  bool bVar1;
  uint32_t uVar2;
  Capability cap;
  Instruction *this_00;
  FeatureManager *pFVar3;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined4 local_78 [2];
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pFVar3 = (this->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar3 == (FeatureManager *)0x0) {
    AnalyzeFeatures(this);
    pFVar3 = (this->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,capability);
  if (!bVar1) {
    this_00 = (Instruction *)operator_new(0x70);
    local_a0._24_8_ = local_a0 + 0x10;
    local_a0._0_8_ = &PTR__SmallVector_003d7c78;
    local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_a0._8_8_ = 1;
    local_78[0] = 0x21;
    local_70._0_8_ = &PTR__SmallVector_003d7c78;
    local_70._8_8_ = 0;
    local_70._24_8_ = local_70 + 0x10;
    local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_a0._16_4_ = capability;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_70,(SmallVector<unsigned_int,_2UL> *)local_a0
              );
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               local_78,&local_48);
    Instruction::Instruction(this_00,this,OpCapability,0,0,(OperandList *)&local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    local_70._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_50,local_50._M_head_impl);
    }
    local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_a0._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_80,local_80._M_head_impl);
    }
    uVar2 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar2 = (uint)this_00->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this_00,uVar2);
    AddCombinatorsForCapability(this,uVar2);
    pFVar3 = (this->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar3 != (FeatureManager *)0x0) {
      uVar2 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar2 = (uint)this_00->has_result_id_;
      }
      cap = Instruction::GetSingleWordOperand(this_00,uVar2);
      FeatureManager::AddCapability(pFVar3,cap);
    }
    if ((this->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((this->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,this_00);
    }
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((this->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                capabilities_).super_IntrusiveList<spvtools::opt::Instruction>,this_00);
  }
  return;
}

Assistant:

void IRContext::AddCapability(spv::Capability capability) {
  if (!get_feature_mgr()->HasCapability(capability)) {
    std::unique_ptr<Instruction> capability_inst(new Instruction(
        this, spv::Op::OpCapability, 0, 0,
        {{SPV_OPERAND_TYPE_CAPABILITY, {static_cast<uint32_t>(capability)}}}));
    AddCapability(std::move(capability_inst));
  }
}